

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O3

XrResult LoaderInstance::CreateInstance
                   (PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                   PFN_xrCreateInstance create_instance_term,
                   PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                   vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   *api_layer_interfaces,XrInstanceCreateInfo *info,
                   unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *loader_instance
                   )

{
  byte bVar1;
  RuntimeInterface *pRVar2;
  ApiLayerInterface *pAVar3;
  PFN_xrCreateApiLayerInstance p_Var4;
  _Alloc_hider _Var5;
  LoaderInstance *pLVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  XrApiLayerNextInfo *pXVar9;
  bool bVar10;
  int iVar11;
  XrResult XVar12;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar13;
  PFN_xrGetInstanceProcAddr p_Var14;
  LoaderInstance *this;
  XrObjectType *pXVar15;
  iterator iVar16;
  const_iterator __begin2;
  pointer pXVar17;
  XrApiLayerNextInfo *pXVar18;
  pointer puVar19;
  ulong uVar20;
  char **ppcVar21;
  unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_> *layer_interface;
  pointer puVar22;
  ulong uVar23;
  XrInstanceCreateInfo *pXVar24;
  size_type __n;
  long lVar25;
  char **__dest;
  XrInstanceCreateInfo *pXVar26;
  char *pcVar27;
  char **ppcVar28;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_skip;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *__range3;
  InstanceCreateInfoManager create_info_manager;
  string msg;
  undefined1 local_458 [32];
  XrApiLayerNextInfo *local_438;
  char **local_430;
  char **local_428;
  XrInstanceCreateInfo *local_420;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *local_418;
  XrInstanceCreateInfo *local_410;
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *local_408;
  char **local_400;
  XrInstance local_3f8;
  PFN_xrCreateApiLayerInstance local_3f0;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_3e8;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0 [19];
  undefined4 local_290;
  char **local_288;
  char **local_280;
  iterator iStack_278;
  char **local_270;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  local_268;
  undefined1 local_250 [24];
  undefined1 local_238 [88];
  ios_base local_1e0 [424];
  XrApiLayerNextInfo *local_38;
  
  local_250._0_8_ = local_250 + 0x10;
  local_418 = api_layer_interfaces;
  local_410 = (XrInstanceCreateInfo *)create_instance_term;
  local_408 = loader_instance;
  local_3f0 = create_api_layer_instance_term;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"xrCreateInstance","");
  local_3d0._0_8_ = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d0,"Entering LoaderInstance::CreateInstance","");
  local_458._0_8_ = (pointer)0x0;
  local_458._8_8_ = (XrApiLayerNextInfo *)0x0;
  local_458._16_8_ = (pointer)0x0;
  LoaderLogger::LogVerboseMessage
            ((string *)local_250,(string *)local_3d0,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_458);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._0_8_ != local_3c0) {
    operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  local_420 = info;
  local_400 = (char **)get_instance_proc_addr_term;
  if (info->enabledExtensionCount == 0) {
    __n = 0;
  }
  else {
    uVar20 = 0;
    do {
      pXVar24 = local_420;
      puVar13 = RuntimeInterface::GetInstance();
      pRVar2 = (puVar13->_M_t).
               super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
               super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
               super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
      std::__cxx11::string::string
                ((string *)local_250,pXVar24->enabledExtensionNames[uVar20],(allocator *)local_3d0);
      bVar10 = RuntimeInterface::SupportsExtension(pRVar2,(string *)local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((!bVar10) &&
         (iVar11 = strcmp(LoaderSpecificExtensions::extensions._M_elems[0].extensionName,
                          local_420->enabledExtensionNames[uVar20]), iVar11 != 0)) {
        puVar22 = (local_418->
                  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        puVar19 = (local_418->
                  super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          if (puVar22 == puVar19) {
            local_250._0_8_ = local_250 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_250,
                       "LoaderInstance::CreateInstance, no support found for requested extension: ",
                       "");
            std::__cxx11::string::append(local_250);
            local_3d0._0_8_ = local_3c0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3d0,"xrCreateInstance","");
            local_458._0_8_ = (pointer)0x0;
            local_458._8_8_ = (pointer)0x0;
            local_458._16_8_ = (pointer)0x0;
            LoaderLogger::LogErrorMessage
                      ((string *)local_3d0,(string *)local_250,
                       (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_458)
            ;
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_458)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._0_8_ != local_3c0) {
              operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
              operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
            }
            return XR_ERROR_EXTENSION_NOT_PRESENT;
          }
          pAVar3 = (puVar22->_M_t).
                   super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>
                   .super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
          std::__cxx11::string::string
                    ((string *)local_250,local_420->enabledExtensionNames[uVar20],
                     (allocator *)local_3d0);
          bVar10 = ApiLayerInterface::SupportsExtension(pAVar3,(string *)local_250);
          if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
            operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          }
          if (bVar10) break;
          puVar22 = puVar22 + 1;
        }
      }
      uVar20 = uVar20 + 1;
      __n = (size_type)local_420->enabledExtensionCount;
    } while (uVar20 < __n);
  }
  pXVar24 = local_420;
  local_3f8 = (XrInstance)0x0;
  local_3d0._0_8_ = local_420;
  memcpy(local_3d0 + 8,local_420,0x148);
  local_280 = (char **)0x0;
  iStack_278._M_current = (char **)0x0;
  local_270 = (char **)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_280,__n);
  if (*(uint32_t *)(local_3d0._0_8_ + 0x138) != 0) {
    lVar25 = 0;
    uVar20 = 0;
    do {
      if (iStack_278._M_current == local_270) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_280,iStack_278,
                   (char **)((long)*(char ***)(local_3d0._0_8_ + 0x140) + lVar25));
      }
      else {
        *iStack_278._M_current = *(char **)((long)*(char ***)(local_3d0._0_8_ + 0x140) + lVar25);
        iStack_278._M_current = iStack_278._M_current + 1;
      }
      uVar20 = uVar20 + 1;
      lVar25 = lVar25 + 8;
    } while (uVar20 < *(uint32_t *)(local_3d0._0_8_ + 0x138));
  }
  local_288 = (char **)0x0;
  if ((long)iStack_278._M_current - (long)local_280 != 0) {
    local_288 = local_280;
  }
  local_290 = (undefined4)((ulong)((long)iStack_278._M_current - (long)local_280) >> 3);
  pXVar26 = pXVar24;
  if (pXVar24->enabledExtensionCount != 0) {
    local_458._0_8_ = (pointer)0x0;
    local_458._8_8_ = (pointer)0x0;
    local_458._16_8_ = (pointer)0x0;
    puVar13 = RuntimeInterface::GetInstance();
    pRVar2 = (puVar13->_M_t).
             super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
             super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
             super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
    local_250._0_8_ = local_250 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,0x13c1b0,0x13c1c2);
    bVar10 = RuntimeInterface::SupportsExtension(pRVar2,(string *)local_250);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
    if (!bVar10) {
      if (local_458._8_8_ == local_458._16_8_) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const(&)[128]>
                  ((vector<char_const*,std::allocator<char_const*>> *)local_458,
                   (iterator)local_458._8_8_,
                   &LoaderSpecificExtensions::extensions._M_elems[0].extensionName);
      }
      else {
        *(char **)local_458._8_8_ = LoaderSpecificExtensions::extensions._M_elems[0].extensionName;
        local_458._8_8_ = local_458._8_8_ + 8;
      }
    }
    if ((local_280 != iStack_278._M_current) &&
       (iVar16._M_current = iStack_278._M_current, pXVar17 = (pointer)local_458._0_8_,
       pXVar18 = (XrApiLayerNextInfo *)local_458._8_8_, ppcVar28 = local_280,
       pXVar9 = (XrApiLayerNextInfo *)local_458._8_8_, local_458._0_8_ != local_458._8_8_)) {
      do {
        local_438 = pXVar9;
        if (ppcVar28 != iVar16._M_current) {
          pcVar27 = (char *)pXVar17->handle;
          uVar23 = (long)iVar16._M_current - (long)ppcVar28;
          uVar20 = uVar23;
          ppcVar21 = ppcVar28;
          local_428 = ppcVar28;
          if (0 < (long)uVar23 >> 5) {
            ppcVar21 = (char **)((uVar23 & 0xffffffffffffffe0) + (long)ppcVar28);
            lVar25 = ((long)uVar23 >> 5) + 1;
            __dest = ppcVar28 + 2;
            local_430 = iVar16._M_current;
            do {
              iVar11 = strcmp(pcVar27,__dest[-2]);
              if (iVar11 == 0) {
                iVar16._M_current = local_430;
                __dest = __dest + -2;
                goto LAB_00111775;
              }
              iVar11 = strcmp(pcVar27,__dest[-1]);
              if (iVar11 == 0) {
                iVar16._M_current = local_430;
                __dest = __dest + -1;
                goto LAB_00111775;
              }
              iVar11 = strcmp(pcVar27,*__dest);
              iVar16._M_current = local_430;
              if (iVar11 == 0) goto LAB_00111775;
              iVar11 = strcmp(pcVar27,__dest[1]);
              iVar16._M_current = local_430;
              if (iVar11 == 0) {
                __dest = __dest + 1;
                goto LAB_00111775;
              }
              lVar25 = lVar25 + -1;
              __dest = __dest + 4;
            } while (1 < lVar25);
            uVar20 = (long)local_430 - (long)ppcVar21;
            pXVar18 = local_438;
          }
          lVar25 = (long)uVar20 >> 3;
          if (lVar25 == 1) {
LAB_0011174a:
            iVar11 = strcmp(pcVar27,*ppcVar21);
            __dest = ppcVar21;
            if (iVar11 != 0) {
              __dest = iVar16._M_current;
            }
LAB_00111775:
            pXVar18 = local_438;
            ppcVar28 = local_428;
            if (__dest != iVar16._M_current) {
              ppcVar21 = __dest + 1;
              if (ppcVar21 != iVar16._M_current) {
                memmove(__dest,ppcVar21,(long)iVar16._M_current - (long)ppcVar21);
                iVar16._M_current = iStack_278._M_current;
                ppcVar28 = local_280;
              }
              iVar16._M_current = iVar16._M_current + -1;
              uVar23 = (long)iVar16._M_current - (long)ppcVar28;
              pXVar18 = local_438;
              iStack_278._M_current = iVar16._M_current;
            }
          }
          else {
            if (lVar25 == 2) {
LAB_00111731:
              iVar11 = strcmp(pcVar27,*ppcVar21);
              __dest = ppcVar21;
              if (iVar11 != 0) {
                ppcVar21 = ppcVar21 + 1;
                goto LAB_0011174a;
              }
              goto LAB_00111775;
            }
            ppcVar28 = local_428;
            if (lVar25 == 3) {
              iVar11 = strcmp(pcVar27,*ppcVar21);
              __dest = ppcVar21;
              if (iVar11 != 0) {
                ppcVar21 = ppcVar21 + 1;
                goto LAB_00111731;
              }
              goto LAB_00111775;
            }
          }
          local_290 = (undefined4)(uVar23 >> 3);
          pXVar24 = local_420;
          local_288 = ppcVar28;
          if (ppcVar28 == iVar16._M_current) {
            local_288 = (char **)0x0;
          }
        }
        pXVar17 = (pointer)&pXVar17->type;
        pXVar9 = local_438;
      } while ((XrApiLayerNextInfo *)pXVar17 != pXVar18);
      local_288 = (char **)0x0;
      if ((long)iVar16._M_current - (long)ppcVar28 != 0) {
        local_288 = ppcVar28;
      }
      local_290 = (undefined4)((ulong)((long)iVar16._M_current - (long)ppcVar28) >> 3);
    }
    if ((pointer)local_458._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_458._0_8_,local_458._16_8_ - local_458._0_8_);
    }
    pXVar26 = (XrInstanceCreateInfo *)(local_3d0 + 8);
  }
  puVar22 = (local_418->
            super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar19 = (local_418->
            super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar22 == puVar19) {
    XVar12 = (*(code *)local_410)(pXVar26,&local_3f8);
    ppcVar28 = local_400;
  }
  else {
    ppcVar28 = (char **)((long)puVar19 - (long)puVar22 >> 3);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = ppcVar28;
    uVar20 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0x128),8) == 0) {
      uVar20 = SUB168(auVar7 * ZEXT816(0x128),0);
    }
    local_438 = (XrApiLayerNextInfo *)operator_new__(uVar20);
    p_Var14 = (PFN_xrGetInstanceProcAddr)((long)ppcVar28 + (ulong)(ppcVar28 == (char **)0x0));
    pXVar15 = (XrObjectType *)&local_438->structSize;
    do {
      ((XrSdkLogObjectInfo *)(pXVar15 + -2))->handle = 0x100000005;
      *(undefined8 *)pXVar15 = 0x128;
      pXVar15 = pXVar15 + 0x4a;
      p_Var14 = p_Var14 + -1;
    } while (p_Var14 != (PFN_xrGetInstanceProcAddr)0x0);
    pcVar27 = local_438[(long)((long)ppcVar28 + -1)].layerName;
    pXVar18 = (XrApiLayerNextInfo *)0x0;
    local_428 = ppcVar28;
    local_410 = pXVar26;
    do {
      pAVar3 = puVar19[-1]._M_t.
               super___uniq_ptr_impl<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>.
               _M_t.
               super__Tuple_impl<0UL,_ApiLayerInterface_*,_std::default_delete<ApiLayerInterface>_>.
               super__Head_base<0UL,_ApiLayerInterface_*,_false>._M_head_impl;
      local_430 = (char **)pAVar3->_get_instance_proc_addr;
      p_Var4 = pAVar3->_create_api_layer_instance;
      _Var5._M_p = (pAVar3->_layer_name)._M_dataplus._M_p;
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_250,_Var5._M_p,_Var5._M_p + (pAVar3->_layer_name)._M_string_length)
      ;
      uVar8 = local_250._0_8_;
      strncpy(pcVar27,(char *)local_250._0_8_,0xff);
      if ((undefined1 *)uVar8 != local_250 + 0x10) {
        operator_delete((void *)uVar8,local_250._16_8_ + 1);
      }
      ppcVar28 = local_430;
      pXVar9 = local_438;
      local_428 = (char **)((long)local_428 + -1);
      puVar19 = puVar19 + -1;
      pcVar27[0xff] = '\0';
      *(XrApiLayerNextInfo **)(pcVar27 + 0x110) = pXVar18;
      pXVar18 = local_438 + (long)local_428;
      *(char ***)(pcVar27 + 0x100) = local_400;
      *(PFN_xrCreateApiLayerInstance *)(pcVar27 + 0x108) = local_3f0;
      pcVar27 = pcVar27 + -0x128;
      local_400 = local_430;
      local_3f0 = p_Var4;
    } while (puVar19 !=
             (local_418->
             super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
    memset(local_238,0,0x200);
    local_250._0_8_ = (pointer)0x100000004;
    local_250._8_8_ = 0x220;
    local_250._16_8_ = 0;
    local_38 = pXVar9;
    XVar12 = (*p_Var4)(local_410,(XrApiLayerCreateInfo *)local_250,&local_3f8);
    operator_delete__(pXVar9);
    pXVar24 = local_420;
  }
  if (XVar12 < XR_SUCCESS) {
    local_250._0_8_ = local_250 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"xrCreateInstance","");
    local_458._0_8_ = (pointer)(local_458 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_458,
               "LoaderInstance::CreateInstance chained CreateInstance call failed","");
    local_3e8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage((string *)local_250,(string *)local_458,&local_3e8);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_3e8);
    if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
      operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
    }
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
  }
  if (local_280 != (char **)0x0) {
    operator_delete(local_280,(long)local_270 - (long)local_280);
  }
  if (XR_ERROR_VALIDATION_FAILURE < XVar12) {
    this = (LoaderInstance *)operator_new(0x58);
    local_268.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (local_418->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_268.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (local_418->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_268.
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (local_418->
         super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_418->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_418->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_418->
    super__Vector_base<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderInstance(this,local_3f8,pXVar24,(PFN_xrGetInstanceProcAddr)ppcVar28,&local_268);
    pLVar6 = (local_408->_M_t).
             super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
             super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
             super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl;
    (local_408->_M_t).super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>.
    _M_t.super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
    super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl = this;
    if (pLVar6 != (LoaderInstance *)0x0) {
      (*pLVar6->_vptr_LoaderInstance[1])();
    }
    std::
    vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ::~vector(&local_268);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_250,"LoaderInstance::CreateInstance succeeded with ",0x2e);
    std::ostream::_M_insert<unsigned_long>((ulong)local_250);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_250," layers enabled and runtime interface - created instance = ",
               0x3b);
    local_458._0_8_ =
         ((local_408->_M_t).
          super___uniq_ptr_impl<LoaderInstance,_std::default_delete<LoaderInstance>_>._M_t.
          super__Tuple_impl<0UL,_LoaderInstance_*,_std::default_delete<LoaderInstance>_>.
          super__Head_base<0UL,_LoaderInstance_*,_false>._M_head_impl)->_runtime_instance;
    local_3d0._0_8_ = local_3c0;
    std::__cxx11::string::_M_construct((ulong)local_3d0,'\x12');
    *(char *)local_3d0._0_8_ = '0';
    *(char *)(local_3d0._0_8_ + 1) = 'x';
    pcVar27 = (char *)(local_3d0._0_8_ + (local_3d0._8_8_ - 1));
    lVar25 = 0;
    do {
      bVar1 = local_458[lVar25];
      *pcVar27 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
      pcVar27[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
      lVar25 = lVar25 + 1;
      pcVar27 = pcVar27 + -2;
    } while (lVar25 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_250,(char *)local_3d0._0_8_,local_3d0._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != local_3c0) {
      operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
    }
    local_3d0._0_8_ = local_3c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"xrCreateInstance","");
    std::__cxx11::stringbuf::str();
    local_3e8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogInfoMessage((string *)local_3d0,(string *)local_458,&local_3e8);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_3e8);
    if ((pointer)local_458._0_8_ != (pointer)(local_458 + 0x10)) {
      operator_delete((void *)local_458._0_8_,(ulong)(local_458._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._0_8_ != local_3c0) {
      operator_delete((void *)local_3d0._0_8_,local_3c0[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
    std::ios_base::~ios_base(local_1e0);
  }
  return XVar12;
}

Assistant:

XrResult LoaderInstance::CreateInstance(PFN_xrGetInstanceProcAddr get_instance_proc_addr_term,
                                        PFN_xrCreateInstance create_instance_term,
                                        PFN_xrCreateApiLayerInstance create_api_layer_instance_term,
                                        std::vector<std::unique_ptr<ApiLayerInterface>> api_layer_interfaces,
                                        const XrInstanceCreateInfo* info, std::unique_ptr<LoaderInstance>* loader_instance) {
    LoaderLogger::LogVerboseMessage("xrCreateInstance", "Entering LoaderInstance::CreateInstance");

    // Check the list of enabled extensions to make sure something supports them, and, if we do,
    // add it to the list of enabled extensions
    XrResult last_error = XR_SUCCESS;
    for (uint32_t ext = 0; ext < info->enabledExtensionCount; ++ext) {
        bool found = false;
        // First check the runtime
        if (RuntimeInterface::GetRuntime().SupportsExtension(info->enabledExtensionNames[ext])) {
            found = true;
        }
        // Next check the loader
        if (!found) {
            for (auto& loader_extension : LoaderInstance::LoaderSpecificExtensions()) {
                if (strcmp(loader_extension.extensionName, info->enabledExtensionNames[ext]) == 0) {
                    found = true;
                    break;
                }
            }
        }
        // Finally, check the enabled layers
        if (!found) {
            for (auto& layer_interface : api_layer_interfaces) {
                if (layer_interface->SupportsExtension(info->enabledExtensionNames[ext])) {
                    found = true;
                    break;
                }
            }
        }
        if (!found) {
            std::string msg = "LoaderInstance::CreateInstance, no support found for requested extension: ";
            msg += info->enabledExtensionNames[ext];
            LoaderLogger::LogErrorMessage("xrCreateInstance", msg);
            last_error = XR_ERROR_EXTENSION_NOT_PRESENT;
            break;
        }
    }

    // Topmost means "closest to the application"
    PFN_xrGetInstanceProcAddr topmost_gipa = get_instance_proc_addr_term;
    XrInstance instance{XR_NULL_HANDLE};

    if (XR_SUCCEEDED(last_error)) {
        // Remove the loader-supported-extensions (debug utils), if it's in the list of enabled extensions but not supported by
        // the runtime.
        InstanceCreateInfoManager create_info_manager{info};
        const XrInstanceCreateInfo* modified_create_info = info;
        if (info->enabledExtensionCount > 0) {
            std::vector<const char*> extensions_to_skip;
            for (const auto& ext : LoaderInstance::LoaderSpecificExtensions()) {
                if (!RuntimeInterface::GetRuntime().SupportsExtension(ext.extensionName)) {
                    extensions_to_skip.emplace_back(ext.extensionName);
                }
            }
            modified_create_info = create_info_manager.FilterOutExtensions(extensions_to_skip);
        }

        // Only start the xrCreateApiLayerInstance stack if we have layers.
        if (!api_layer_interfaces.empty()) {
            // Initialize an array of ApiLayerNextInfo structs
            std::unique_ptr<XrApiLayerNextInfo[]> next_info_list(new XrApiLayerNextInfo[api_layer_interfaces.size()]);
            size_t ni_index = api_layer_interfaces.size() - 1;
            for (size_t i = 0; i <= ni_index; i++) {
                next_info_list[i].structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_NEXT_INFO;
                next_info_list[i].structVersion = XR_API_LAYER_NEXT_INFO_STRUCT_VERSION;
                next_info_list[i].structSize = sizeof(XrApiLayerNextInfo);
            }

            // Go through all layers, and override the instance pointers with the layer version.  However,
            // go backwards through the layer list so we replace in reverse order so the layers can call their next function
            // appropriately.
            PFN_xrCreateApiLayerInstance topmost_cali_fp = create_api_layer_instance_term;
            XrApiLayerNextInfo* topmost_nextinfo = nullptr;
            for (auto layer_interface = api_layer_interfaces.rbegin(); layer_interface != api_layer_interfaces.rend();
                 ++layer_interface) {
                // Collect current layer's function pointers
                PFN_xrGetInstanceProcAddr cur_gipa_fp = (*layer_interface)->GetInstanceProcAddrFuncPointer();
                PFN_xrCreateApiLayerInstance cur_cali_fp = (*layer_interface)->GetCreateApiLayerInstanceFuncPointer();

                // Fill in layer info and link previous (lower) layer fxn pointers
                strncpy(next_info_list[ni_index].layerName, (*layer_interface)->LayerName().c_str(),
                        XR_MAX_API_LAYER_NAME_SIZE - 1);
                next_info_list[ni_index].layerName[XR_MAX_API_LAYER_NAME_SIZE - 1] = '\0';
                next_info_list[ni_index].next = topmost_nextinfo;
                next_info_list[ni_index].nextGetInstanceProcAddr = topmost_gipa;
                next_info_list[ni_index].nextCreateApiLayerInstance = topmost_cali_fp;

                // Update saved pointers for next iteration
                topmost_nextinfo = &next_info_list[ni_index];
                topmost_gipa = cur_gipa_fp;
                topmost_cali_fp = cur_cali_fp;
                ni_index--;
            }

            // Populate the ApiLayerCreateInfo struct and pass to topmost CreateApiLayerInstance()
            XrApiLayerCreateInfo api_layer_ci = {};
            api_layer_ci.structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_CREATE_INFO;
            api_layer_ci.structVersion = XR_API_LAYER_CREATE_INFO_STRUCT_VERSION;
            api_layer_ci.structSize = sizeof(XrApiLayerCreateInfo);
            api_layer_ci.loaderInstance = nullptr;  // Not used.
            api_layer_ci.settings_file_location[0] = '\0';
            api_layer_ci.nextInfo = next_info_list.get();
            //! @todo do we filter our create info extension list here?
            //! Think that actually each layer might need to filter...
            last_error = topmost_cali_fp(modified_create_info, &api_layer_ci, &instance);

        } else {
            // The loader's terminator is the topmost CreateInstance if there are no layers.
            last_error = create_instance_term(modified_create_info, &instance);
        }

        if (XR_FAILED(last_error)) {
            LoaderLogger::LogErrorMessage("xrCreateInstance", "LoaderInstance::CreateInstance chained CreateInstance call failed");
        }
    }

    if (XR_SUCCEEDED(last_error)) {
        loader_instance->reset(new LoaderInstance(instance, info, topmost_gipa, std::move(api_layer_interfaces)));

        std::ostringstream oss;
        oss << "LoaderInstance::CreateInstance succeeded with ";
        oss << (*loader_instance)->LayerInterfaces().size();
        oss << " layers enabled and runtime interface - created instance = ";
        oss << HandleToHexString((*loader_instance)->GetInstanceHandle());
        LoaderLogger::LogInfoMessage("xrCreateInstance", oss.str());
    }

    return last_error;
}